

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O2

int __thiscall
ddd::DictionarySGL<false,_false>::stat(DictionarySGL<false,_false> *this,char *__file,stat *__buf)

{
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  DaTrie<false,_false,_false> *this_00;
  pointer pBVar4;
  pointer pcVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  this_00 = (this->trie_)._M_t.
            super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
  uVar3 = this_00->bc_emps_;
  pBVar4 = *(pointer *)
            ((long)&(this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 0x10);
  lVar1 = *(long *)&(this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>;
  auVar8._8_4_ = (int)lVar1;
  auVar8._0_8_ = lVar1;
  auVar8._12_4_ = (int)((ulong)lVar1 >> 0x20);
  uVar7 = (ulong)((long)*(pointer *)
                         ((long)&(this_00->bc_).
                                 super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8) - lVar1)
          >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar7 - uVar3);
  *(ulong *)(__file + 0x18) = uVar7 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)((long)pBVar4 - auVar8._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar3;
  pcVar5 = *(pointer *)
            ((long)&(this_00->tail_).super__Vector_base<char,_std::allocator<char>_> + 0x10);
  pcVar2 = (this_00->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar9._8_4_ = (int)pcVar2;
  auVar9._0_8_ = pcVar2;
  auVar9._12_4_ = (int)((ulong)pcVar2 >> 0x20);
  *(ulong *)(__file + 0x30) =
       (long)*(pointer *)
              ((long)&(this_00->tail_).super__Vector_base<char,_std::allocator<char>_> + 8) -
       (long)pcVar2 & 0xffffffff;
  *(ulong *)(__file + 0x38) = (long)pcVar5 - auVar9._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)this_00->tail_emps_;
  sVar6 = DaTrie<false,_false,_false>::size_in_bytes(this_00);
  *(size_t *)(__file + 0x48) = sVar6 + 8;
  return (int)(sVar6 + 8);
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = trie_->num_nodes();
    ret.bc_size = trie_->bc_size();
    ret.bc_capa = trie_->bc_capa();
    ret.bc_emps = trie_->bc_emps();
    ret.tail_size = trie_->tail_size();
    ret.tail_capa = trie_->tail_capa();
    ret.tail_emps = trie_->tail_emps();
    ret.size_in_bytes = trie_->size_in_bytes() + sizeof(num_keys_);
  }